

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O2

int Timidity::convert_vibrato_sweep(Renderer *song,BYTE sweep,int vib_control_ratio)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,sweep) != 0) {
    return (int)(((float)vib_control_ratio * 2490368.0) / ((float)sweep * song->rate));
  }
  return 0;
}

Assistant:

int convert_vibrato_sweep(Renderer *song, BYTE sweep, int vib_control_ratio)
{
	if (sweep == 0)
		return 0;

	return
		(int) (FSCALE((double) (vib_control_ratio) * SWEEP_TUNING, SWEEP_SHIFT) / (song->rate * sweep));

	/* this was overflowing with seashore.pat

	((vib_control_ratio * SWEEP_TUNING) << SWEEP_SHIFT) / (song->rate * sweep);
	*/
}